

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O0

EncodeNumberStatus
spvtools::utils::ParseAndEncodeNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  function<void_(unsigned_int)> *type_00;
  NumberType *text_00;
  bool bVar1;
  function<void_(unsigned_int)> local_90;
  function<void_(unsigned_int)> local_70;
  ErrorMsgStream local_50;
  ErrorMsgStream local_40;
  string *local_30;
  string *error_msg_local;
  function<void_(unsigned_int)> *emit_local;
  NumberType *type_local;
  char *text_local;
  
  local_30 = error_msg;
  error_msg_local = (string *)emit;
  emit_local = (function<void_(unsigned_int)> *)type;
  type_local = (NumberType *)text;
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_40,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_40,"The given text is a nullptr");
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_40);
    text_local._4_4_ = kInvalidText;
  }
  else {
    bVar1 = IsUnknown(type);
    if (bVar1) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,local_30);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_50,"The expected type is not a integer or float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_50);
      text_local._4_4_ = kInvalidUsage;
    }
    else {
      bVar1 = IsFloating((NumberType *)emit_local);
      text_00 = type_local;
      type_00 = emit_local;
      if (bVar1) {
        std::function<void_(unsigned_int)>::function(&local_70,emit);
        text_local._4_4_ =
             ParseAndEncodeFloatingPointNumber
                       ((char *)text_00,(NumberType *)type_00,&local_70,local_30);
        std::function<void_(unsigned_int)>::~function(&local_70);
      }
      else {
        std::function<void_(unsigned_int)>::function(&local_90,emit);
        text_local._4_4_ =
             ParseAndEncodeIntegerNumber((char *)text_00,(NumberType *)type_00,&local_90,local_30);
        std::function<void_(unsigned_int)>::~function(&local_90);
      }
    }
  }
  return text_local._4_4_;
}

Assistant:

EncodeNumberStatus ParseAndEncodeNumber(const char* text,
                                        const NumberType& type,
                                        std::function<void(uint32_t)> emit,
                                        std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (IsUnknown(type)) {
    ErrorMsgStream(error_msg)
        << "The expected type is not a integer or float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  // If we explicitly expect a floating-point number, we should handle that
  // first.
  if (IsFloating(type)) {
    return ParseAndEncodeFloatingPointNumber(text, type, emit, error_msg);
  }

  return ParseAndEncodeIntegerNumber(text, type, emit, error_msg);
}